

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O2

int __thiscall helics::ActionMessage::toByteArray(ActionMessage *this,byte *data,size_t buffer_size)

{
  undefined4 uVar1;
  pointer pbVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  byte *pbVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  ulong uVar8;
  pointer pbVar9;
  int local_38;
  
  if ((toByteArray(std::byte*,unsigned_long)::littleEndian == '\0') &&
     (iVar3 = __cxa_guard_acquire(&toByteArray(std::byte*,unsigned_long)::littleEndian), iVar3 != 0)
     ) {
    toByteArray::littleEndian = '\x01';
    __cxa_guard_release(&toByteArray(std::byte*,unsigned_long)::littleEndian);
  }
  uVar6 = (this->payload).bufferSize;
  uVar4 = 0xffffff;
  if (uVar6 < 0xffffff) {
    uVar4 = (uint)uVar6;
  }
  uVar5 = 0;
  if (this->messageAction != cmd_time_request) {
    uVar5 = uVar4;
  }
  local_38 = -1;
  if (buffer_size != 0 && data != (byte *)0x0) {
    uVar8 = (ulong)uVar5;
    uVar6 = uVar8 + 0x2d;
    if (uVar6 <= buffer_size) {
      *data = toByteArray::littleEndian;
      data[1] = (byte)(uVar5 >> 0x10);
      data[2] = (byte)(uVar5 >> 8);
      data[3] = (byte)uVar5;
      *(undefined8 *)(data + 4) = *(undefined8 *)this;
      *(BaseType *)(data + 0xc) = (this->source_id).gid;
      *(BaseType *)(data + 0x10) = (this->source_handle).hid;
      *(BaseType *)(data + 0x14) = (this->dest_id).gid;
      *(BaseType *)(data + 0x18) = (this->dest_handle).hid;
      *(uint16_t *)(data + 0x1c) = this->counter;
      *(uint16_t *)(data + 0x1e) = this->flags;
      *(uint32_t *)(data + 0x20) = this->sequenceID;
      *(baseType *)(data + 0x24) = (this->actionTime).internalTimeCode;
      if (this->messageAction == cmd_time_request) {
        *(baseType *)(data + 0x2c) = (this->Te).internalTimeCode;
        *(baseType *)(data + 0x34) = (this->Tdemin).internalTimeCode;
        *(baseType *)(data + 0x3c) = (this->Tso).internalTimeCode;
        data[0x44] = 0;
        local_38 = 0x45;
      }
      else {
        pbVar7 = data + 0x2c;
        if (uVar5 != 0) {
          memcpy(pbVar7,(this->payload).heap,uVar8);
          pbVar7 = pbVar7 + uVar8;
        }
        *pbVar7 = (0xfffffe < (this->payload).bufferSize) +
                  (char)((uint)(*(int *)&(this->stringData).
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                               *(int *)&(this->stringData).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 5);
        pbVar7 = pbVar7 + 1;
        pbVar2 = (this->stringData).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar9 = (this->stringData).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar2;
            pbVar9 = pbVar9 + 1) {
          uVar1 = (undefined4)pbVar9->_M_string_length;
          uVar6 = (ulong)((int)uVar6 + uVar1 + 4);
          if (buffer_size < uVar6) {
            return -1;
          }
          *(undefined4 *)pbVar7 = uVar1;
          memcpy(pbVar7 + 4,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length);
          pbVar7 = pbVar7 + 4 + pbVar9->_M_string_length;
        }
        uVar8 = (this->payload).bufferSize;
        if (0xffffff < uVar8) {
          if (buffer_size < ((uVar6 & 0xffffffff) + uVar8) - 0xfffffb) {
            return -1;
          }
          *(undefined4 *)pbVar7 = (int)uVar8 - 0xffffff;
          memcpy(pbVar7 + 4,(this->payload).heap + 0xffffff,(this->payload).bufferSize - 0xffffff);
          pbVar7 = pbVar7 + 4 + ((this->payload).bufferSize - 0xffffff);
        }
        local_38 = (int)data;
        local_38 = (int)pbVar7 - local_38;
      }
    }
  }
  return local_38;
}

Assistant:

int ActionMessage::toByteArray(std::byte* data, std::size_t buffer_size) const
{
    static const uint8_t littleEndian = isLittleEndian();

    // put the main string size in the first 4 bytes;
    std::uint32_t ssize{0UL};
    if (messageAction != CMD_TIME_REQUEST) {
        if (payload.size() >= maxPayloadSize) {
            ssize = maxPayloadSize;
        } else {
            ssize = static_cast<uint32_t>(payload.size());
        }
    }

    if ((data == nullptr) || (buffer_size == 0) || buffer_size < action_message_base_size + ssize) {
        return -1;
    }

    std::byte* dataStart = data;

    *data = static_cast<std::byte>(littleEndian);
    data[1] = static_cast<std::byte>(ssize >> 16U);
    data[2] = static_cast<std::byte>((ssize >> 8U) & 0xFFU);
    data[3] = static_cast<std::byte>(ssize & 0xFFU);
    data += sizeof(uint32_t);  // 4
    *reinterpret_cast<action_message_def::action_t*>(data) = messageAction;
    data += sizeof(action_message_def::action_t);
    *reinterpret_cast<int32_t*>(data) = messageID;
    data += sizeof(int32_t);  // 8
    *reinterpret_cast<int32_t*>(data) = source_id.baseValue();
    data += sizeof(int32_t);  // 12
    *reinterpret_cast<int32_t*>(data) = source_handle.baseValue();
    data += sizeof(int32_t);  // 16
    *reinterpret_cast<int32_t*>(data) = dest_id.baseValue();
    data += sizeof(int32_t);  // 20
    *reinterpret_cast<int32_t*>(data) = dest_handle.baseValue();
    data += sizeof(int32_t);  // 24
    *reinterpret_cast<uint16_t*>(data) = counter;
    data += sizeof(uint16_t);  // 26
    *reinterpret_cast<uint16_t*>(data) = flags;
    data += sizeof(uint16_t);  // 28
    *reinterpret_cast<int32_t*>(data) = sequenceID;
    data += sizeof(int32_t);  // 32
    auto baseTimeCode = actionTime.getBaseTimeCode();
    std::memcpy(data, &(baseTimeCode), sizeof(Time::baseType));
    data += sizeof(Time::baseType);  // 40

    if (messageAction == CMD_TIME_REQUEST) {
        baseTimeCode = Te.getBaseTimeCode();
        std::memcpy(data, &(baseTimeCode), sizeof(Time::baseType));
        data += sizeof(Time::baseType);
        baseTimeCode = Tdemin.getBaseTimeCode();
        std::memcpy(data, &(baseTimeCode), sizeof(Time::baseType));
        data += sizeof(Time::baseType);
        baseTimeCode = Tso.getBaseTimeCode();
        std::memcpy(data, &(baseTimeCode), sizeof(Time::baseType));
        data += sizeof(Time::baseType);
        *data = std::byte{0};
        ++data;
        return static_cast<int>(data - dataStart);
    }

    if (ssize > 0) {
        std::memcpy(data, payload.data(), ssize);
        data += ssize;
    }
    if (payload.size() >= maxPayloadSize) {
        *data = static_cast<std::byte>(stringData.size() + 1);
    } else {
        *data = static_cast<std::byte>(stringData.size());
    }

    ++data;
    ssize += action_message_base_size;
    for (const auto& str : stringData) {
        auto strsize = static_cast<uint32_t>(str.size());
        if (buffer_size < ssize + strsize + 4) {
            return -1;
        }

        std::memcpy(data, &strsize, sizeof(uint32_t));
        data += sizeof(uint32_t);
        std::memcpy(data, str.data(), str.size());
        data += str.size();
        ssize += strsize + 4;
    }
    if (payload.size() > maxPayloadSize) {
        if (buffer_size < ssize + payload.size() - maxPayloadSize + 4) {
            return -1;
        }
        auto strsize = static_cast<uint32_t>(payload.size() - maxPayloadSize);
        std::memcpy(data, &strsize, sizeof(uint32_t));
        data += sizeof(uint32_t);
        std::memcpy(data, payload.data() + maxPayloadSize, payload.size() - maxPayloadSize);
        data += payload.size() - maxPayloadSize;
    }
    //   }
    auto actSize = static_cast<int>(data - dataStart);
    return actSize;
}